

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes1.cc
# Opt level: O3

Node * __thiscall Node::DownLink(Node *this,Node *Node0,int Ptr)

{
  Node *pNVar1;
  Node *pNVar2;
  
  if (Node0 != (Node *)0x0) {
    pNVar1 = this->Block[Ptr];
    if (this->Block[Ptr] == (Node *)0x0) {
      pNVar2 = (Node *)(this->Tree + (long)Ptr + -5);
    }
    else {
      do {
        pNVar2 = pNVar1;
        pNVar1 = pNVar2->Block[0];
      } while (pNVar2->Block[0] != (Node *)0x0);
    }
    pNVar2->Block[0] = Node0;
  }
  return this;
}

Assistant:

Node *Node::DownLink
(
	Node *Node0,	/**< Node to link in */
	int Ptr		/**< Slot to link it into */
)
{
	//
	// Don't link if nothing to link to
	//
	if (this == 0)
	{
		return(Node0);
	}

	//
	// Skip out if link node is 0
	//
	if (Node0 == 0)
	{
		return this;
	}

	//
	// If we aren't at the top of the stack, scan to the end
	//
	if (Block[Ptr] == 0)
	{
		Block[Ptr] = Node0;
		return this;
	}

	Node* LookDown = Block[Ptr];
	while (LookDown->Block[0] != 0)
	{
		LookDown = LookDown->Block[0];
	}

	//
	// Attach them together
	//
	LookDown->Block[0] = Node0;

	//
	// Return main node back
	//
	return(this);
}